

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullptr_test.c
# Opt level: O1

void nullptr_test(int converter)

{
  SRC_STATE *state;
  char *pcVar1;
  undefined8 uVar2;
  char *__format;
  int error;
  SRC_DATA src_data;
  int local_9c;
  SRC_DATA local_98;
  SRC_DATA local_58;
  
  src_get_name(converter);
  printf("        nullptr_test        (%-28s) ....... ");
  fflush(_stdout);
  memset(nullptr_test::input,0,0x40000);
  memset(nullptr_test::output,0,0x40000);
  state = src_new(converter,1,&local_9c);
  if (state == (SRC_STATE *)0x0) {
    pcVar1 = src_strerror(local_9c);
    __format = "\n\nLine %d : src_new() failed : %s\n\n";
    uVar2 = 0x29;
  }
  else {
    local_98.src_ratio = 1.1;
    local_98.input_frames = 0x10000;
    local_98.output_frames = 0x10000;
    local_98.data_in = nullptr_test::input;
    local_98.data_out = nullptr_test::output;
    local_98.output_frames_gen = 0;
    local_9c = src_process(state,&local_98);
    if (local_9c == 0) {
      local_58.data_out = local_98.data_out;
      local_58.output_frames = local_98.output_frames;
      local_58.end_of_input = local_98.end_of_input;
      local_58._52_4_ = local_98._52_4_;
      local_58.src_ratio = local_98.src_ratio;
      local_58.input_frames_used = local_98.input_frames_used;
      local_58.output_frames_gen = local_98.output_frames_gen;
      local_58.data_in = (float *)0x0;
      local_58.input_frames = 0;
      local_9c = src_process(state,&local_58);
      if (local_9c == 0) {
        local_58.data_in = local_98.data_in;
        local_58.input_frames = local_98.input_frames;
        local_58.end_of_input = local_98.end_of_input;
        local_58._52_4_ = local_98._52_4_;
        local_58.src_ratio = local_98.src_ratio;
        local_58.input_frames_used = local_98.input_frames_used;
        local_58.output_frames_gen = local_98.output_frames_gen;
        local_58.data_out = (float *)0x0;
        local_58.output_frames = 0;
        local_9c = src_process(state,&local_58);
        if (local_9c == 0) {
          local_58.end_of_input = local_98.end_of_input;
          local_58._52_4_ = local_98._52_4_;
          local_58.src_ratio = local_98.src_ratio;
          local_58.input_frames_used = local_98.input_frames_used;
          local_58.output_frames_gen = local_98.output_frames_gen;
          local_58.data_in = (float *)0x0;
          local_58.data_out = (float *)0x0;
          local_58.input_frames = 0;
          local_58.output_frames = 0;
          local_9c = src_process(state,&local_58);
          if (local_9c == 0) {
            src_delete(state);
            puts("ok");
            return;
          }
          pcVar1 = src_strerror(local_9c);
          __format = "\n\nLine %d : %s\n\n";
          uVar2 = 0x55;
        }
        else {
          pcVar1 = src_strerror(local_9c);
          __format = "\n\nLine %d : %s\n\n";
          uVar2 = 0x49;
        }
      }
      else {
        pcVar1 = src_strerror(local_9c);
        __format = "\n\nLine %d : %s\n\n";
        uVar2 = 0x3f;
      }
    }
    else {
      pcVar1 = src_strerror(local_9c);
      __format = "\n\nLine %d : %s\n\n";
      uVar2 = 0x35;
    }
  }
  printf(__format,uVar2,pcVar1);
  exit(1);
}

Assistant:

static void
nullptr_test (int converter)
{	static float input [BUFFER_LEN * NUM_CHANNELS] ;
	static float output [BUFFER_LEN * NUM_CHANNELS] ;

	SRC_STATE* src_state ;
	SRC_DATA src_data, src_data2 ;

	int error ;

	printf ("        nullptr_test        (%-28s) ....... ", src_get_name (converter)) ;
	fflush (stdout) ;

	memset (input, 0, sizeof (input)) ;
	memset (output, 0, sizeof (output)) ;

	if ((src_state = src_new (converter, NUM_CHANNELS, &error)) == NULL)
	{	printf ("\n\nLine %d : src_new() failed : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	src_data.src_ratio = 1.1 ;
	src_data.input_frames = BUFFER_LEN ;
	src_data.output_frames = BUFFER_LEN ;
	src_data.data_in = input ;
	src_data.data_out = output ;
	src_data.output_frames_gen = 0 ;

	if ((error = src_process (src_state, &src_data)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	//Input is zero-length
	src_data2 = src_data;
	src_data2.data_in = NULL;
	src_data2.input_frames = 0;

	if ((error = src_process (src_state, &src_data2)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	//Output is zero-length
	src_data2 = src_data;
	src_data2.data_out = NULL;
	src_data2.output_frames = 0;

	if ((error = src_process (src_state, &src_data2)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	//Input and output are zero-length
	src_data2 = src_data;
	src_data2.data_in = NULL;
	src_data2.data_out = NULL;
	src_data2.input_frames = 0;
	src_data2.output_frames = 0;

	if ((error = src_process (src_state, &src_data2)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;


	src_state = src_delete (src_state) ;

	puts ("ok") ;
}